

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

_Bool is_compatible(VariableType *var_type,VariableType *val_type)

{
  _Bool _Var1;
  VariableType *val_type_local;
  VariableType *var_type_local;
  
  if (var_type->type_code == RAVI_TANY) {
    var_type_local._7_1_ = true;
  }
  else {
    _Var1 = is_nillable(var_type);
    if ((_Var1) && (val_type->type_code == RAVI_TNIL)) {
      var_type_local._7_1_ = true;
    }
    else if ((val_type->type_code == var_type->type_code) &&
            (val_type->type_name == var_type->type_name)) {
      var_type_local._7_1_ = true;
    }
    else if (((var_type->type_code == RAVI_TNUMFLT) && (val_type->type_code == RAVI_TNUMINT)) ||
            ((var_type->type_code == RAVI_TNUMINT && (val_type->type_code == RAVI_TNUMFLT)))) {
      var_type_local._7_1_ = true;
    }
    else {
      var_type_local._7_1_ = false;
    }
  }
  return var_type_local._7_1_;
}

Assistant:

static bool is_compatible(const VariableType *var_type, const VariableType *val_type)
{
	if (var_type->type_code == RAVI_TANY)
		return true;
	if (is_nillable(var_type) && val_type->type_code == RAVI_TNIL)
		return true;
	if (val_type->type_code == var_type->type_code && val_type->type_name == var_type->type_name)
		return true;
	if ((var_type->type_code == RAVI_TNUMFLT && val_type->type_code == RAVI_TNUMINT) ||
	    (var_type->type_code == RAVI_TNUMINT && val_type->type_code == RAVI_TNUMFLT))
		/* Maybe conversion is possible so allow */
		return true;
	return false;
}